

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

void delete_bb(gen_ctx_t gen_ctx,bb_t_conflict bb)

{
  in_edge_t peVar1;
  loop_node_t_conflict plVar2;
  gen_ctx *pgVar3;
  bb_t pbVar4;
  bb_t pbVar5;
  bitmap_t pVVar6;
  void *__ptr;
  void *__ptr_00;
  HTAB_MIR_item_t *pHVar7;
  long lVar8;
  MIR_item_t pMVar9;
  bb_t_conflict bb_00;
  edge_t_conflict peVar10;
  uint uVar11;
  MIR_context_t pMVar12;
  DLIST_LINK_bb_t *pDVar13;
  DLIST_out_edge_t *pDVar14;
  DLIST_dead_var_t *pDVar15;
  DLIST_LINK_MIR_item_t *pDVar16;
  bb_t pbVar17;
  DLIST_LINK_in_edge_t *pDVar18;
  VARR_void_ptr_t *pVVar19;
  HTAB_MIR_item_t **ppHVar20;
  FILE *pFVar21;
  size_t *rpost;
  loop_node_t plVar22;
  MIR_context_t pMVar23;
  out_edge_t peVar24;
  loop_node_t_conflict __ptr_01;
  loop_node_t plVar25;
  loop_node_t __ptr_02;
  gen_ctx_t pgVar26;
  gen_ctx_t __ptr_03;
  
  peVar10 = (bb->out_edges).head;
  pMVar12 = (MIR_context_t)bb;
  while (peVar10 != (edge_t_conflict)0x0) {
    peVar24 = (peVar10->out_link).next;
    delete_edge(peVar10);
    peVar10 = peVar24;
  }
  peVar10 = (bb->in_edges).head;
  while (peVar10 != (edge_t_conflict)0x0) {
    peVar1 = (peVar10->in_link).next;
    delete_edge(peVar10);
    peVar10 = peVar1;
  }
  plVar2 = bb->loop_node;
  __ptr_01 = (loop_node_t_conflict)0x0;
  if (plVar2 == (loop_node_t_conflict)0x0) {
LAB_0015f827:
    pbVar4 = (bb_t)gen_ctx->curr_cfg;
    pbVar5 = (bb->bb_link).prev;
    if (pbVar5 == (bb_t)0x0) {
      if ((bb_t_conflict)pbVar4->bfs == bb) {
        pbVar17 = (bb->bb_link).next;
        pbVar4->bfs = (size_t)pbVar17;
        goto LAB_0015f853;
      }
LAB_0015f984:
      delete_bb_cold_3();
    }
    else {
      pbVar17 = (bb->bb_link).next;
      (pbVar5->bb_link).next = pbVar17;
LAB_0015f853:
      if ((pbVar17 != (bb_t)0x0) || (pbVar17 = pbVar4, (pbVar4->bb_link).prev == bb)) {
        (pbVar17->bb_link).prev = pbVar5;
        (bb->bb_link).prev = (bb_t)0x0;
        (bb->bb_link).next = (bb_t)0x0;
        plVar25 = (loop_node_t)bb->in;
        if ((plVar25 == (loop_node_t)0x0) ||
           (__ptr_01 = plVar25->entry, __ptr_01 == (loop_node_t)0x0)) {
          plVar25 = __ptr_01;
          delete_bb_cold_10();
LAB_0015f96b:
          delete_bb_cold_9();
LAB_0015f970:
          __ptr_02 = plVar25;
          delete_bb_cold_8();
LAB_0015f975:
          delete_bb_cold_7();
LAB_0015f97a:
          __ptr_01 = __ptr_02;
          delete_bb_cold_6();
        }
        else {
          free(__ptr_01);
          free(plVar25);
          plVar22 = (loop_node_t)bb->out;
          if ((plVar22 == (loop_node_t)0x0) ||
             (plVar25 = plVar22->entry, plVar25 == (loop_node_t)0x0)) goto LAB_0015f96b;
          free(plVar25);
          free(plVar22);
          __ptr_02 = (loop_node_t)bb->gen;
          plVar25 = plVar22;
          if ((__ptr_02 == (loop_node_t)0x0) ||
             (plVar25 = __ptr_02->entry, plVar25 == (loop_node_t)0x0)) goto LAB_0015f970;
          free(plVar25);
          free(__ptr_02);
          plVar25 = (loop_node_t)bb->kill;
          if ((plVar25 == (loop_node_t)0x0) ||
             (__ptr_02 = plVar25->entry, __ptr_02 == (loop_node_t)0x0)) goto LAB_0015f975;
          free(__ptr_02);
          free(plVar25);
          __ptr_01 = (loop_node_t_conflict)bb->dom_in;
          __ptr_02 = plVar25;
          if ((__ptr_01 == (loop_node_t_conflict)0x0) ||
             (__ptr_02 = __ptr_01->entry, __ptr_02 == (loop_node_t)0x0)) goto LAB_0015f97a;
          free(__ptr_02);
          free(__ptr_01);
          pVVar6 = bb->dom_out;
          if ((pVVar6 != (bitmap_t)0x0) &&
             (__ptr_01 = (loop_node_t_conflict)pVVar6->varr, __ptr_01 != (loop_node_t_conflict)0x0))
          {
            free(__ptr_01);
            free(pVVar6);
            free(bb);
            return;
          }
        }
        delete_bb_cold_5();
        goto LAB_0015f984;
      }
    }
    delete_bb_cold_4();
LAB_0015f98e:
    delete_bb_cold_1();
  }
  else {
    plVar25 = plVar2->parent;
    if (plVar25->entry == plVar2) {
      plVar25->entry = (loop_node_t)0x0;
    }
    pgVar3 = (gen_ctx *)(plVar2->children_link).prev;
    if (pgVar3 == (gen_ctx *)0x0) {
      if ((plVar25->children).head == plVar2) {
        plVar22 = (plVar2->children_link).next;
        (plVar25->children).head = plVar22;
        goto LAB_0015f7d8;
      }
      goto LAB_0015f98e;
    }
    plVar22 = (plVar2->children_link).next;
    pgVar3->addr_regs = (bitmap_t)plVar22;
LAB_0015f7d8:
    if (plVar22 != (loop_node_t)0x0) {
      pMVar12 = (MIR_context_t)&plVar22->children_link;
LAB_0015f7f4:
      pMVar12->gen_ctx = pgVar3;
      (plVar2->children_link).prev = (loop_node_t)0x0;
      (plVar2->children_link).next = (loop_node_t)0x0;
      __ptr_01 = bb->loop_node;
      if ((__ptr_01->u).preheader != (loop_node_t)0x0) {
        (((__ptr_01->u).preheader)->u).preheader = (loop_node_t)0x0;
        __ptr_01 = bb->loop_node;
      }
      free(__ptr_01);
      goto LAB_0015f827;
    }
    pMVar12 = (MIR_context_t)0x0;
    if ((plVar25->children).tail == plVar2) {
      pMVar12 = (MIR_context_t)&(plVar25->children).tail;
      goto LAB_0015f7f4;
    }
  }
  delete_bb_cold_2();
  __ptr = *(void **)__ptr_01;
  if (((__ptr == (void *)0x0) || (uVar11 = *(int *)&__ptr_01->parent - 0xa7, 0xd < uVar11)) ||
     ((0x2007U >> (uVar11 & 0x1f) & 1) == 0)) {
    return;
  }
  if ((2 < uVar11) || (__ptr_00 = *(void **)((long)__ptr + 8), __ptr_00 == (void *)0x0)) {
LAB_0015f9df:
    free(__ptr);
    return;
  }
  pgVar26 = *(gen_ctx_t *)((long)__ptr_00 + 0x10);
  if (pgVar26 != (gen_ctx_t)0x0) {
    free(pgVar26);
    free(__ptr_00);
    goto LAB_0015f9df;
  }
  delete_insn_data_cold_1();
  DLIST_bb_insn_t_remove
            ((DLIST_bb_insn_t *)&((DLIST_in_edge_t *)&pMVar12->temp_string)->head[1].in_link.next,
             (bb_insn_t_conflict)pMVar12);
  pMVar12->gen_ctx->ctx = (MIR_context_t)0x0;
  pMVar23 = pMVar12;
  clear_bb_insn_dead_vars(pgVar26,(bb_insn_t_conflict)pMVar12);
  pHVar7 = pMVar12->module_item_tab;
  if (pHVar7 == (HTAB_MIR_item_t *)0x0) {
LAB_0015fa46:
    free(pMVar12);
    return;
  }
  pgVar26 = (gen_ctx_t)((DLIST_LINK_in_edge_t *)&pHVar7->arg)->prev;
  if (pgVar26 != (gen_ctx_t)0x0) {
    free(pgVar26);
    free(pHVar7);
    goto LAB_0015fa46;
  }
  delete_bb_insn_cold_1();
  if ((pgVar26 != (gen_ctx_t)0x0) && (pMVar23 != (MIR_context_t)0x0)) {
    pbVar4 = ((DLIST_LINK_bb_t *)&pMVar23->insn_nops)->prev;
    if (pbVar4 == (bb_t)0x0) {
      if (pgVar26->ctx != pMVar23) goto LAB_0015fab2;
      pMVar12 = (MIR_context_t)pMVar23->unspec_protos;
      pgVar26->ctx = pMVar12;
    }
    else {
      pMVar12 = (MIR_context_t)pMVar23->unspec_protos;
      (pbVar4->bb_link).next = (bb_t)pMVar12;
    }
    if (pMVar12 == (MIR_context_t)0x0) {
      if (*(MIR_context_t *)&pgVar26->optimize_level != pMVar23) goto LAB_0015fab7;
      pDVar13 = (DLIST_LINK_bb_t *)&pgVar26->optimize_level;
    }
    else {
      pDVar13 = (DLIST_LINK_bb_t *)&pMVar12->insn_nops;
    }
    pDVar13->prev = pbVar4;
    ((DLIST_LINK_bb_t *)&pMVar23->insn_nops)->prev = (bb_t)0x0;
    pMVar23->unspec_protos = (VARR_MIR_proto_t *)0x0;
    return;
  }
  DLIST_bb_insn_t_remove_cold_1();
LAB_0015fab2:
  DLIST_bb_insn_t_remove_cold_2();
LAB_0015fab7:
  DLIST_bb_insn_t_remove_cold_3();
  peVar24 = (out_edge_t)pMVar23->temp_data;
  if (peVar24 != (out_edge_t)0x0) {
    __ptr_03 = pgVar26;
    do {
      pbVar4 = peVar24->dst;
      peVar1 = (peVar24->in_link).prev;
      pDVar18 = (DLIST_LINK_in_edge_t *)&pbVar4->rpost;
      if (pbVar4 == (bb_t)0x0) {
        pDVar18 = (DLIST_LINK_in_edge_t *)&pMVar23->temp_data;
      }
      pDVar18->prev = peVar1;
      if (peVar1 == (in_edge_t)0x0) {
        pDVar14 = (DLIST_out_edge_t *)&pMVar23->used_label_p;
        if (((DLIST_out_edge_t *)&pMVar23->used_label_p)->head != peVar24) {
          clear_bb_insn_dead_vars_cold_1();
          pbVar4 = (bb_t)(__ptr_03->free_dead_vars).tail;
          if (pbVar4 == (bb_t)0x0) {
            if ((__ptr_03->free_dead_vars).head == (dead_var_t_conflict)0x0) {
              pDVar15 = &__ptr_03->free_dead_vars;
              goto LAB_0015fb56;
            }
          }
          else {
            if (pbVar4->rpost == 0) {
              pDVar15 = (DLIST_dead_var_t *)&pbVar4->rpost;
LAB_0015fb56:
              pDVar15->head = (dead_var_t_conflict)peVar24;
              (peVar24->in_link).prev = (in_edge_t)0x0;
              peVar24->dst = pbVar4;
              (__ptr_03->free_dead_vars).tail = (dead_var_t_conflict)peVar24;
              return;
            }
            free_dead_var_cold_1();
          }
          free_dead_var_cold_2();
          pMVar12 = __ptr_03->ctx;
          pHVar7 = *(HTAB_MIR_item_t **)&__ptr_03->debug_level;
          if (pHVar7 == (HTAB_MIR_item_t *)0x0) {
            if ((gen_ctx_t)pMVar12->used_label_p == __ptr_03) {
              pVVar19 = __ptr_03->to_free;
              pMVar12->used_label_p = (VARR_uint8_t *)pVVar19;
              goto LAB_0015fb9d;
            }
            delete_edge_cold_1();
LAB_0015fc0f:
            delete_edge_cold_2();
LAB_0015fc14:
            delete_edge_cold_3();
LAB_0015fc19:
            delete_edge_cold_4();
            pbVar4 = peVar24->src;
            peVar24->src = (bb_t)((long)&pbVar4->index + 1);
            *(bb_t *)&__ptr_03->optimize_level = pbVar4;
            for (pVVar6 = __ptr_03->addr_regs; pVVar6 != (bitmap_t)0x0;
                pVVar6 = (bitmap_t)pVVar6[1].varr) {
              bb_00 = (bb_t_conflict)pVVar6->size;
              if (bb_00->pre == 0) {
                DFS(bb_00,(size_t *)peVar24,rpost);
              }
              else if (bb_00->rpost == 0) {
                *(undefined1 *)((long)&pVVar6[2].els_num + 1) = 1;
              }
            }
            pMVar9 = (MIR_item_t)*rpost;
            *rpost = (size_t)((long)&pMVar9[-1].u + 7);
            __ptr_03->curr_func_item = pMVar9;
            return;
          }
          pVVar19 = __ptr_03->to_free;
          pHVar7->free_func = (_func_void_MIR_item_t_void_ptr *)pVVar19;
LAB_0015fb9d:
          if (pVVar19 == (VARR_void_ptr_t *)0x0) {
            if ((gen_ctx_t)pMVar12->module_item_tab != __ptr_03) goto LAB_0015fc0f;
            ppHVar20 = &pMVar12->module_item_tab;
          }
          else {
            ppHVar20 = (HTAB_MIR_item_t **)&pVVar19[1].size;
          }
          *ppHVar20 = pHVar7;
          *(undefined8 *)&__ptr_03->debug_level = 0;
          __ptr_03->to_free = (VARR_void_ptr_t *)0x0;
          lVar8 = *(long *)&__ptr_03->optimize_level;
          pMVar9 = __ptr_03->curr_func_item;
          if (pMVar9 == (MIR_item_t)0x0) {
            if (*(gen_ctx_t *)(lVar8 + 0x30) != __ptr_03) goto LAB_0015fc14;
            pFVar21 = __ptr_03->debug_file;
            *(FILE **)(lVar8 + 0x30) = pFVar21;
          }
          else {
            pFVar21 = __ptr_03->debug_file;
            (pMVar9->item_link).next = (MIR_item_t)pFVar21;
          }
          if (pFVar21 == (FILE *)0x0) {
            if (*(gen_ctx_t *)(lVar8 + 0x38) != __ptr_03) goto LAB_0015fc19;
            pDVar16 = (DLIST_LINK_MIR_item_t *)(lVar8 + 0x38);
          }
          else {
            pDVar16 = (DLIST_LINK_MIR_item_t *)&pFVar21->_IO_read_end;
          }
          pDVar16->prev = pMVar9;
          free(__ptr_03);
          return;
        }
      }
      else {
        pDVar14 = (DLIST_out_edge_t *)&peVar1->dst;
      }
      pDVar14->head = (out_edge_t)pbVar4;
      peVar24->dst = (bb_t)0x0;
      (peVar24->in_link).prev = (in_edge_t)0x0;
      __ptr_03 = pgVar26;
      free_dead_var(pgVar26,(dead_var_t_conflict)peVar24);
      peVar24 = (out_edge_t)pMVar23->temp_data;
    } while (peVar24 != (out_edge_t)0x0);
  }
  return;
}

Assistant:

static void delete_bb (gen_ctx_t gen_ctx, bb_t bb) {
  edge_t e, next_e;

  for (e = DLIST_HEAD (out_edge_t, bb->out_edges); e != NULL; e = next_e) {
    next_e = DLIST_NEXT (out_edge_t, e);
    delete_edge (e);
  }
  for (e = DLIST_HEAD (in_edge_t, bb->in_edges); e != NULL; e = next_e) {
    next_e = DLIST_NEXT (in_edge_t, e);
    delete_edge (e);
  }
  if (bb->loop_node != NULL) {
    if (bb->loop_node->parent->entry == bb->loop_node) bb->loop_node->parent->entry = NULL;
    DLIST_REMOVE (loop_node_t, bb->loop_node->parent->children, bb->loop_node);
    if (bb->loop_node->u.preheader_loop != NULL)
      bb->loop_node->u.preheader_loop->u.preheader = NULL;
    free (bb->loop_node);
  }
  DLIST_REMOVE (bb_t, curr_cfg->bbs, bb);
  bitmap_destroy (bb->in);
  bitmap_destroy (bb->out);
  bitmap_destroy (bb->gen);
  bitmap_destroy (bb->kill);
  bitmap_destroy (bb->dom_in);
  bitmap_destroy (bb->dom_out);
  free (bb);
}